

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O3

void __thiscall
lscpp::stdio_transporter::write_message_impl(stdio_transporter *this,string *str,bool close_file)

{
  pointer __buf;
  size_t __n;
  int __fd;
  
  __buf = (str->_M_dataplus)._M_p;
  __n = str->_M_string_length;
  write(1,__buf,__n);
  if ((this->comm_logger_).super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
      super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
      super__Optional_payload_base<lscpp::comm_logger>._M_engaged == true) {
    comm_logger::open_out((comm_logger *)this);
    __fd = fileno((FILE *)(this->comm_logger_).
                          super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
                          super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
                          super__Optional_payload_base<lscpp::comm_logger>._M_payload._M_value.
                          cur_file_);
    write(__fd,__buf,__n);
    if (close_file) {
      (this->comm_logger_).super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
      super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
      super__Optional_payload_base<lscpp::comm_logger>._M_payload._M_value.file_open_ = false;
      fclose((FILE *)(this->comm_logger_).super__Optional_base<lscpp::comm_logger,_false,_false>.
                     _M_payload.super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
                     super__Optional_payload_base<lscpp::comm_logger>._M_payload._M_value.cur_file_)
      ;
      return;
    }
  }
  return;
}

Assistant:

void stdio_transporter::write_message_impl(std::string str, bool close_file) {
  const char *cstr = str.c_str();
  std::size_t sizeof_reply = str.size();
  ::write(stdout_fileno, cstr, sizeof_reply);
  log_out_message(comm_logger_, cstr, sizeof_reply, close_file);
}